

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O2

void bssl::dtls1_update_mtu(SSL *ssl)

{
  uint32_t uVar1;
  long lVar2;
  
  if (ssl->d1->mtu < 0xe4) {
    uVar1 = SSL_get_options(ssl);
    if ((uVar1 >> 0xc & 1) == 0) {
      lVar2 = BIO_ctrl((BIO *)(ssl->wbio)._M_t.
                              super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,0x28,0,(void *)0x0
                      );
      if (lVar2 - 0xe4U < 0x3fffff1d) {
        ssl->d1->mtu = (uint)lVar2;
      }
      else {
        ssl->d1->mtu = 0x5c0;
        BIO_ctrl((BIO *)(ssl->wbio)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t
                        .super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,0x2a,0x5c0,(void *)0x0);
      }
    }
  }
  if (0xe3 < ssl->d1->mtu) {
    return;
  }
  __assert_fail("ssl->d1->mtu >= dtls1_min_mtu()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                ,0x293,"void bssl::dtls1_update_mtu(SSL *)");
}

Assistant:

static void dtls1_update_mtu(SSL *ssl) {
  // TODO(davidben): No consumer implements |BIO_CTRL_DGRAM_SET_MTU| and the
  // only |BIO_CTRL_DGRAM_QUERY_MTU| implementation could use
  // |SSL_set_mtu|. Does this need to be so complex?
  if (ssl->d1->mtu < dtls1_min_mtu() &&
      !(SSL_get_options(ssl) & SSL_OP_NO_QUERY_MTU)) {
    long mtu = BIO_ctrl(ssl->wbio.get(), BIO_CTRL_DGRAM_QUERY_MTU, 0, NULL);
    if (mtu >= 0 && mtu <= (1 << 30) && (unsigned)mtu >= dtls1_min_mtu()) {
      ssl->d1->mtu = (unsigned)mtu;
    } else {
      ssl->d1->mtu = kDefaultMTU;
      BIO_ctrl(ssl->wbio.get(), BIO_CTRL_DGRAM_SET_MTU, ssl->d1->mtu, NULL);
    }
  }

  // The MTU should be above the minimum now.
  assert(ssl->d1->mtu >= dtls1_min_mtu());
}